

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O0

Vec3f embree::getVec3f(char **token)

{
  size_t sVar1;
  long *in_RSI;
  char **in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 in_XMM1_Da;
  Vec3f VVar5;
  float z;
  float y;
  float x;
  
  fVar2 = getFloat(in_RDI);
  sVar1 = strspn((char *)*in_RSI," \t");
  *in_RSI = sVar1 + *in_RSI;
  if (*(char *)*in_RSI == '\0') {
    *(float *)in_RDI = fVar2;
    *(float *)((long)in_RDI + 4) = fVar2;
    *(float *)(in_RDI + 1) = fVar2;
    fVar4 = fVar2;
  }
  else {
    fVar3 = getFloat(in_RDI);
    fVar4 = getFloat(in_RDI);
    *(float *)in_RDI = fVar2;
    *(float *)((long)in_RDI + 4) = fVar3;
    *(float *)(in_RDI + 1) = fVar4;
  }
  VVar5.field_0.field_0.y = 0.0;
  VVar5.field_0.field_0.x = fVar4;
  VVar5.field_0.field_0.z = (float)in_XMM1_Da;
  return (Vec3f)VVar5.field_0;
}

Assistant:

static inline Vec3f getVec3f(const char*& token) {
    float x = getFloat(token);
    token += strspn(token, " \t");
    if (*token == 0) return Vec3f(x);
    float y = getFloat(token);
    float z = getFloat(token);
    return Vec3f(x,y,z);
  }